

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O0

void tcmalloc::ThreadCache::RecomputePerThreadCacheSize(void)

{
  double *pdVar1;
  undefined4 uVar2;
  undefined1 auVar4 [16];
  int local_64;
  ThreadCache *local_60;
  ThreadCache *h;
  size_t claimed;
  double local_48;
  double local_40;
  double ratio;
  size_t min_size;
  size_t space;
  double dStack_20;
  int n;
  memory_order local_18;
  undefined4 local_14;
  memory_order __b;
  undefined1 auVar3 [16];
  
  if (thread_heap_count_ < 1) {
    local_64 = 1;
  }
  else {
    local_64 = thread_heap_count_;
  }
  space._4_4_ = local_64;
  min_size = overall_thread_cache_size_ / (ulong)(long)local_64;
  ___b = &min_per_thread_cache_size_;
  local_14 = 0;
  local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
  dStack_20 = min_per_thread_cache_size_;
  ratio = min_per_thread_cache_size_;
  if (min_size < (ulong)min_per_thread_cache_size_) {
    min_size = (size_t)min_per_thread_cache_size_;
  }
  if (0x400000 < min_size) {
    min_size = 0x400000;
  }
  auVar3._8_4_ = (int)(min_size >> 0x20);
  auVar3._0_8_ = min_size;
  auVar3._12_4_ = 0x45300000;
  uVar2 = (undefined4)min_size;
  local_48 = 1.0;
  auVar4._8_4_ = (int)(per_thread_cache_size_ >> 0x20);
  auVar4._0_8_ = per_thread_cache_size_;
  auVar4._12_4_ = 0x45300000;
  claimed = (size_t)((auVar4._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)per_thread_cache_size_) - 4503599627370496.0))
  ;
  pdVar1 = std::max<double>(&local_48,(double *)&claimed);
  local_40 = ((auVar3._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar2) - 4503599627370496.0)) / *pdVar1;
  h = (ThreadCache *)0x0;
  for (local_60 = thread_heaps_; local_60 != (ThreadCache *)0x0; local_60 = local_60->next_) {
    if (local_40 < 1.0) {
      SetMaxSize(local_60,(int)((double)local_60->max_size_ * local_40));
    }
    h = (ThreadCache *)((long)&h->list_[0].list_ + (long)local_60->max_size_);
  }
  unclaimed_cache_space_ = overall_thread_cache_size_ - (long)h;
  per_thread_cache_size_ = min_size;
  return;
}

Assistant:

void ThreadCache::RecomputePerThreadCacheSize() {
  // Divide available space across threads
  int n = thread_heap_count_ > 0 ? thread_heap_count_ : 1;
  size_t space = overall_thread_cache_size_ / n;

  size_t min_size = min_per_thread_cache_size_.load(std::memory_order_relaxed);
  // Limit to allowed range
  if (space < min_size) space = min_size;
  if (space > kMaxThreadCacheSize) space = kMaxThreadCacheSize;

  double ratio = space / std::max<double>(1, per_thread_cache_size_);
  size_t claimed = 0;
  for (ThreadCache* h = thread_heaps_; h != nullptr; h = h->next_) {
    // Increasing the total cache size should not circumvent the
    // slow-start growth of max_size_.
    if (ratio < 1.0) {
      h->SetMaxSize(h->max_size_ * ratio);
    }
    claimed += h->max_size_;
  }
  unclaimed_cache_space_ = overall_thread_cache_size_ - claimed;
  per_thread_cache_size_ = space;
}